

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedBlackTree.cpp
# Opt level: O2

void __thiscall RedBlackTree::insertElement(RedBlackTree *this,int value)

{
  Node *pNVar1;
  Node *node;
  
  node = (Node *)operator_new(0x20);
  node->value = value;
  *(undefined8 *)&node->color = 0;
  *(undefined8 *)((long)&node->left + 4) = 0;
  node->right = (Node *)0x0;
  node->parent = (Node *)0x0;
  pNVar1 = insert(this,&this->root,&node);
  this->root = pNVar1;
  fixInsert(this,&node);
  return;
}

Assistant:

void RedBlackTree::insertElement(int value) {
    auto *node = new Node(value);
    root = insert(root, node);
    fixInsert(node);
}